

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  reference rVar7;
  bool local_139;
  reference local_f0;
  undefined4 local_dc;
  reference local_d8;
  string local_c8 [8];
  string direction;
  int local_a8;
  int local_a4;
  int clonePos;
  int cloneFloor;
  int start;
  int iStack_94;
  bool first;
  int elevatorPos;
  int elevatorFloor;
  int i;
  fixed_t f;
  allocator<int> local_49;
  undefined1 local_48 [8];
  elevators_t e;
  int local_28;
  int nbElevators;
  int nbAdditionalElevators;
  int nbTotalClones;
  int exitPos;
  int exitFloor;
  int nbRounds;
  int width;
  int nbFloors;
  
  width = 0;
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&nbRounds);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&exitFloor);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&exitPos);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&nbTotalClones);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&nbAdditionalElevators);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&nbElevators);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_28);
  std::istream::operator>>
            (piVar3,(int *)((long)&e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 4));
  std::istream::ignore();
  iVar2 = e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ + 1;
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar2,&local_49);
  std::allocator<int>::~allocator(&local_49);
  sVar4 = (size_type)
          e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  elevatorFloor._3_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&elevatorFloor + 2));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i,sVar4,(bool *)((long)&elevatorFloor + 3),
             (allocator<bool> *)((long)&elevatorFloor + 2));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&elevatorFloor + 2));
  for (elevatorPos = 0;
      elevatorPos <
      e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; elevatorPos = elevatorPos + 1) {
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&stack0xffffffffffffff6c);
    std::istream::operator>>(piVar3,&start);
    std::istream::ignore();
    iVar2 = start;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)iStack_94);
    *pvVar5 = iVar2;
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,
                      (long)e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
  *pvVar5 = nbAdditionalElevators;
  cloneFloor._3_1_ = 1;
  clonePos = -1;
  do {
    std::__cxx11::string::string(local_c8);
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_a4);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_a8);
    std::operator>>(piVar3,local_c8);
    std::istream::ignore();
    local_139 = true;
    if (local_a4 != -1) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&i,(long)local_a4);
      local_d8 = rVar7;
      local_139 = std::_Bit_reference::operator_cast_to_bool(&local_d8);
    }
    if (local_139 == false) {
      if ((cloneFloor._3_1_ & 1) != 0) {
        clonePos = local_a8;
        cloneFloor._3_1_ = 0;
      }
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a4);
      poVar6 = std::operator<<(poVar6,"/");
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_48);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      iVar2 = local_a8;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_a4);
      if (iVar2 < *pvVar5) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"RIGHT");
        if (!bVar1) goto LAB_001036ff;
LAB_00103756:
        poVar6 = std::operator<<((ostream *)&std::cout,"WAIT");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&i,(long)local_a4);
        local_f0 = rVar7;
        std::_Bit_reference::operator=(&local_f0,true);
      }
      else {
LAB_001036ff:
        iVar2 = local_a8;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_a4);
        if (*pvVar5 < iVar2) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c8,"LEFT");
          if (bVar1) goto LAB_00103756;
        }
        iVar2 = local_a8;
        if (local_a4 < 1) {
LAB_00103811:
          if ((local_a4 != 0) || (local_a8 == clonePos)) {
            poVar6 = std::operator<<((ostream *)&std::cout,"WAIT");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            goto LAB_00103891;
          }
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_48,(long)(local_a4 + -1));
          if (iVar2 == *pvVar5) goto LAB_00103811;
        }
        poVar6 = std::operator<<((ostream *)&std::cout,"BLOCK");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
LAB_00103891:
      local_dc = 0;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"WAIT");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_dc = 5;
    }
    std::__cxx11::string::~string(local_c8);
  } while( true );
}

Assistant:

int main()
{
    int nbFloors; // number of floors
    int width; // width of the area
    int nbRounds; // maximum number of rounds
    int exitFloor; // floor on which the exit is found
    int exitPos; // position of the exit on its floor
    int nbTotalClones; // number of generated clones
    int nbAdditionalElevators; // ignore (always zero)
    int nbElevators; // number of elevators
    cin >> nbFloors >> width >> nbRounds >> exitFloor >> exitPos >> nbTotalClones >> nbAdditionalElevators >> nbElevators; cin.ignore();
    
    typedef std::pair<int, int> pair_t;
    typedef std::vector<int> elevators_t;
    typedef std::vector<bool> fixed_t;
    
    elevators_t e(nbElevators + 1);
    fixed_t f(nbElevators, false);
    for (int i = 0; i < nbElevators; i++)
    {
        int elevatorFloor; // floor on which this elevator is found
        int elevatorPos; // position of the elevator on its floor
        cin >> elevatorFloor >> elevatorPos;
        cin.ignore();
        e[elevatorFloor] = elevatorPos;
    }
    e[nbElevators] = exitPos;
    
    bool first = true;
    int start = -1;
    while (1)
    {
        int cloneFloor; // floor of the leading clone
        int clonePos; // position of the leading clone on its floor
        string direction; // direction of the leading clone: LEFT or RIGHT
        cin >> cloneFloor >> clonePos >> direction; cin.ignore();

        if (-1 == cloneFloor || f[cloneFloor])
        {
            cout << "WAIT" << endl;
            continue;
        }
        if (first)
        {
            start = clonePos;
            first = false;
        }
        
        cerr << cloneFloor << "/" << e.size() << endl;
        if ((clonePos < e[cloneFloor] && direction == "RIGHT")
            || (clonePos > e[cloneFloor] && direction == "LEFT"))
        {
            cout << "WAIT" << endl;
            f[cloneFloor] = true;
        } else
        {
            if ((0 < cloneFloor && clonePos != e[cloneFloor - 1])
                || (0 == cloneFloor && clonePos != start))
            {
                cout << "BLOCK" << endl;
            }
            else
            {
                cout << "WAIT" << endl;
            }
        }
    }
}